

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2table.cpp
# Opt level: O0

int __thiscall QuantNet::quantize_ACIQ(QuantNet *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *this_00;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference ppLVar6;
  reference pvVar7;
  float *pfVar8;
  reference pvVar9;
  Mat *pMVar10;
  reference pvVar11;
  long in_RDI;
  float fVar12;
  float fVar13;
  double dVar14;
  float *in_stack_00000040;
  float *in_stack_00000048;
  Mat *in_stack_00000050;
  float scale;
  QuantBlobStat *stat_1;
  int i_2;
  QuantBlobStat *stat;
  int k_3;
  float *ptr;
  int p;
  int outsize;
  int outc;
  float absmax_3;
  Mat out;
  int j_1;
  Mat in;
  int pixel_convert_type;
  vector<float,_std::allocator<float>_> *norm_vals;
  vector<float,_std::allocator<float>_> *mean_vals;
  int type_to_pixel;
  int j;
  int thread_num;
  Extractor ex;
  int i_1;
  float threshold_3;
  int k_2;
  float absmax_2;
  Mat weight_data_n_2;
  int n_2;
  int weight_data_size_output_2;
  int num_output_1;
  InnerProduct *innerproduct;
  float threshold_2;
  int k_1;
  float absmax_1;
  Mat weight_data_n_1;
  int n_1;
  vector<float,_std::allocator<float>_> scales;
  int weight_data_size_output_1;
  int group;
  ConvolutionDepthWise *convolutiondepthwise;
  float threshold_1;
  float threshold;
  int k;
  float absmax;
  Mat weight_data_n;
  int n;
  bool quant_6bit;
  int weight_data_size_output;
  int stride_h;
  int stride_w;
  int dilation_h;
  int dilation_w;
  int kernel_h;
  int kernel_w;
  int num_output;
  Convolution *convolution;
  Layer *layer;
  int i;
  vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_>
  workspace_allocators;
  vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_> blob_allocators;
  int image_count;
  int conv_bottom_blob_count;
  int conv_layer_count;
  int input_blob_count;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  allocator_type *in_stack_fffffffffffffba0;
  Extractor *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  float in_stack_fffffffffffffbb4;
  Mat *in_stack_fffffffffffffbb8;
  reference in_stack_fffffffffffffbc8;
  int iVar15;
  int in_stack_fffffffffffffbd0;
  float in_stack_fffffffffffffbd4;
  float *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  float in_stack_fffffffffffffbf4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbf8;
  int local_344;
  float local_338;
  int local_334;
  int in_stack_fffffffffffffcf4;
  Mat *in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd04;
  Extractor *in_stack_fffffffffffffd08;
  int local_2e0;
  float local_2d4;
  Mat local_2d0;
  int local_284;
  uint local_234;
  reference local_230;
  reference local_228;
  value_type local_21c;
  int local_218;
  int local_214;
  Extractor local_210;
  uint local_1fc;
  float local_1f8;
  float local_1f4;
  int local_1f0;
  float local_1ec;
  Mat local_1e8;
  int local_19c;
  int local_198;
  int local_194;
  value_type local_190;
  float local_188;
  float local_184;
  int local_180;
  float local_17c;
  Mat local_178;
  int local_12c;
  int local_110;
  int local_10c;
  value_type local_108;
  float local_fc;
  float local_f8;
  float local_f4;
  int local_f0;
  float local_ec;
  Mat local_e8;
  int local_a0;
  byte local_99;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  value_type local_78;
  value_type local_70;
  int local_68;
  vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_> local_60 [2];
  vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_> local_30;
  uint local_18;
  int local_14;
  int local_10;
  int local_c;
  
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0));
  local_c = (int)sVar3;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8));
  local_10 = (int)sVar3;
  sVar3 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110));
  local_14 = (int)sVar3;
  pvVar4 = std::
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)(in_RDI + 0x60),0);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(pvVar4);
  local_18 = (uint)sVar3;
  std::allocator<ncnn::UnlockedPoolAllocator>::allocator
            ((allocator<ncnn::UnlockedPoolAllocator> *)0x14fbeb);
  std::vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_>::vector
            ((vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             (size_type)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  std::allocator<ncnn::UnlockedPoolAllocator>::~allocator
            ((allocator<ncnn::UnlockedPoolAllocator> *)0x14fc17);
  std::allocator<ncnn::UnlockedPoolAllocator>::allocator
            ((allocator<ncnn::UnlockedPoolAllocator> *)0x14fc43);
  std::vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_>::vector
            ((vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_> *)
             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
             (size_type)in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
  std::allocator<ncnn::UnlockedPoolAllocator>::~allocator
            ((allocator<ncnn::UnlockedPoolAllocator> *)0x14fc6f);
  for (local_68 = 0; local_68 < local_10; local_68 = local_68 + 1) {
    this_00 = *(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xf8),(long)local_68);
    ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        (this_00,(long)*pvVar5);
    local_70 = *ppLVar6;
    bVar1 = std::operator==(in_stack_fffffffffffffb90,
                            (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    if (bVar1) {
      local_78 = local_70;
      local_7c = *(int *)&local_70[1]._vptr_Layer;
      local_80 = *(int *)((long)&local_70[1]._vptr_Layer + 4);
      local_84._0_1_ = local_70[1].one_blob_only;
      local_84._1_1_ = local_70[1].support_inplace;
      local_84._2_1_ = local_70[1].support_vulkan;
      local_84._3_1_ = local_70[1].support_packing;
      local_88._0_1_ = local_70[1].support_bf16_storage;
      local_88._1_1_ = local_70[1].support_fp16_storage;
      local_88._2_1_ = local_70[1].support_int8_storage;
      local_88._3_1_ = local_70[1].support_image_storage;
      local_8c._0_1_ = local_70[1].support_tensor_storage;
      local_8c._1_1_ = local_70[1].support_weight_fp16_storage;
      local_8c._2_1_ = local_70[1].support_reserved_0;
      local_8c._3_1_ = local_70[1].support_reserved_1;
      local_90._0_1_ = local_70[1].support_reserved_2;
      local_90._1_1_ = local_70[1].support_reserved_3;
      local_90._2_1_ = local_70[1].support_reserved_4;
      local_90._3_1_ = local_70[1].support_reserved_5;
      local_94._0_1_ = local_70[1].support_reserved_6;
      local_94._1_1_ = local_70[1].support_reserved_7;
      local_94._2_1_ = local_70[1].support_reserved_8;
      local_94._3_1_ = local_70[1].support_reserved_9;
      local_98 = *(int *)&local_70[1].type.field_0x4 / local_7c;
      local_99 = 0;
      if ((((local_80 == 3) && (local_84 == 3)) && (local_88 == 1)) &&
         (((local_8c == 1 && (local_90 == 1)) && (local_94 == 1)))) {
        local_99 = 1;
      }
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x158),(long)local_68);
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                        (int)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                        (size_t)in_stack_fffffffffffffba0,
                        (Allocator *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      for (local_a0 = 0; local_a0 < local_7c; local_a0 = local_a0 + 1) {
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                         (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                         (int)in_stack_fffffffffffffb90);
        local_ec = 0.0;
        for (local_f0 = 0; local_f0 < local_98; local_f0 = local_f0 + 1) {
          pfVar8 = ncnn::Mat::operator[](&local_e8,(long)local_f0);
          dVar14 = std::fabs((double)(ulong)(uint)*pfVar8);
          local_f4 = SUB84(dVar14,0);
          pfVar8 = std::max<float>(&local_ec,&local_f4);
          local_ec = *pfVar8;
        }
        iVar15 = (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20);
        if ((local_99 & 1) == 0) {
          local_fc = compute_aciq_gaussian_clip
                               (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,iVar15);
          fVar12 = 127.0 / local_fc;
          pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x158),
                              (long)local_68);
          pfVar8 = ncnn::Mat::operator[](pvVar7,(long)local_a0);
          *pfVar8 = fVar12;
        }
        else {
          local_f8 = compute_aciq_gaussian_clip
                               (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,iVar15);
          fVar12 = 31.0 / local_f8;
          pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                             ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x158),
                              (long)local_68);
          pfVar8 = ncnn::Mat::operator[](pvVar7,(long)local_a0);
          *pfVar8 = fVar12;
        }
        ncnn::Mat::~Mat((Mat *)0x150153);
      }
    }
    bVar1 = std::operator==(in_stack_fffffffffffffb90,
                            (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    if (bVar1) {
      local_108 = local_70;
      local_10c = (int)local_70[1].type._M_string_length;
      local_110 = *(int *)&local_70[1].type.field_0x4 / local_10c;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x1501ed);
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x158),(long)local_68);
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                        (int)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                        (size_t)in_stack_fffffffffffffba0,
                        (Allocator *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      for (local_12c = 0; local_12c < local_10c; local_12c = local_12c + 1) {
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                         (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                         (int)in_stack_fffffffffffffb90);
        local_17c = 0.0;
        for (local_180 = 0; local_180 < local_110; local_180 = local_180 + 1) {
          pfVar8 = ncnn::Mat::operator[](&local_178,(long)local_180);
          dVar14 = std::fabs((double)(ulong)(uint)*pfVar8);
          local_184 = SUB84(dVar14,0);
          pfVar8 = std::max<float>(&local_17c,&local_184);
          local_17c = *pfVar8;
        }
        local_188 = compute_aciq_gaussian_clip
                              (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,
                               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
        fVar12 = 127.0 / local_188;
        pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x158),
                            (long)local_68);
        pfVar8 = ncnn::Mat::operator[](pvVar7,(long)local_12c);
        *pfVar8 = fVar12;
        ncnn::Mat::~Mat((Mat *)0x15041b);
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffba0);
    }
    bVar1 = std::operator==(in_stack_fffffffffffffb90,
                            (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
    if (bVar1) {
      local_190 = local_70;
      local_194 = *(int *)&local_70[1]._vptr_Layer;
      local_198 = *(int *)&local_70[1].one_blob_only / local_194;
      std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x158),(long)local_68);
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                        (int)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                        (size_t)in_stack_fffffffffffffba0,
                        (Allocator *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      for (local_19c = 0; local_19c < local_194; local_19c = local_19c + 1) {
        ncnn::Mat::range((Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                         (int)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                         (int)in_stack_fffffffffffffb90);
        local_1ec = 0.0;
        for (local_1f0 = 0; local_1f0 < local_198; local_1f0 = local_1f0 + 1) {
          in_stack_fffffffffffffbf8 =
               (vector<int,_std::allocator<int>_> *)
               ncnn::Mat::operator[](&local_1e8,(long)local_1f0);
          dVar14 = std::fabs((double)(ulong)(uint)*(float *)&(in_stack_fffffffffffffbf8->
                                                                                                                          
                                                  super__Vector_base<int,_std::allocator<int>_>).
                                                  _M_impl.super__Vector_impl_data._M_start);
          in_stack_fffffffffffffbf4 = SUB84(dVar14,0);
          local_1f4 = in_stack_fffffffffffffbf4;
          in_stack_fffffffffffffbe8 = std::max<float>(&local_1ec,&local_1f4);
          local_1ec = *in_stack_fffffffffffffbe8;
        }
        local_1f8 = compute_aciq_gaussian_clip
                              (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,
                               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
        in_stack_fffffffffffffbd4 = 127.0 / local_1f8;
        pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x158),
                            (long)local_68);
        pfVar8 = ncnn::Mat::operator[](pvVar7,(long)local_19c);
        *pfVar8 = in_stack_fffffffffffffbd4;
        ncnn::Mat::~Mat((Mat *)0x1506b8);
      }
    }
  }
  for (local_1fc = 0; (int)local_1fc < (int)local_18; local_1fc = local_1fc + 1) {
    if ((int)local_1fc % 100 == 0) {
      fprintf(_stderr,"count the absmax %.2f%% [ %d / %d ]\n",
              (double)(((float)(int)local_1fc * 100.0) / (float)(int)local_18),(ulong)local_1fc,
              (ulong)local_18);
    }
    ncnn::Net::create_extractor
              ((Net *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    in_stack_fffffffffffffbd0 = ncnn::get_omp_thread_num();
    local_214 = in_stack_fffffffffffffbd0;
    pvVar9 = std::vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_>
             ::operator[](&local_30,(long)in_stack_fffffffffffffbd0);
    ncnn::Extractor::set_blob_allocator(&local_210,&pvVar9->super_Allocator);
    pvVar9 = std::vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_>
             ::operator[](local_60,(long)local_214);
    ncnn::Extractor::set_workspace_allocator(&local_210,&pvVar9->super_Allocator);
    for (local_218 = 0; local_218 < local_c; local_218 = local_218 + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)local_218);
      local_21c = *pvVar5;
      local_228 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                *)(in_RDI + 0x78),(long)local_218);
      local_230 = std::
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                *)(in_RDI + 0x90),(long)local_218);
      local_234 = 2;
      if (local_21c != 2) {
        local_234 = local_21c << 0x10 | 2;
      }
      in_stack_fffffffffffffbc8 =
           std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)(in_RDI + 0xa8),(long)local_218);
      pvVar4 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[]((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)(in_RDI + 0x60),(long)local_218);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](pvVar4,(long)(int)local_1fc);
      read_and_resize_image
                (in_stack_fffffffffffffbf8,
                 (string *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                 (int)((ulong)in_stack_fffffffffffffbe8 >> 0x20));
      std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)0x150930);
      std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)0x150942);
      ncnn::Mat::substract_mean_normalize(in_stack_00000050,in_stack_00000048,in_stack_00000040);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe0),(long)local_218);
      ncnn::Extractor::input
                (in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                 (Mat *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
      ncnn::Mat::~Mat((Mat *)0x15099b);
    }
    for (local_284 = 0; local_284 < local_14; local_284 = local_284 + 1) {
      ncnn::Mat::Mat(&local_2d0);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x110),(long)local_284);
      ncnn::Extractor::extract
                (in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffcf8,
                 in_stack_fffffffffffffcf4);
      iVar15 = local_2d0.c;
      local_2d4 = 0.0;
      iVar2 = local_2d0.w * local_2d0.h;
      for (local_2e0 = 0; local_2e0 < iVar15; local_2e0 = local_2e0 + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffffbb8,(int)in_stack_fffffffffffffbb4);
        pMVar10 = (Mat *)ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xfffffffffffffcd0);
        ncnn::Mat::~Mat((Mat *)0x150aca);
        in_stack_fffffffffffffbb8 = pMVar10;
        for (local_334 = 0; local_334 < iVar2; local_334 = local_334 + 1) {
          dVar14 = std::fabs((double)(ulong)(uint)*(float *)((long)&pMVar10->data +
                                                            (long)local_334 * 4));
          in_stack_fffffffffffffbb4 = SUB84(dVar14,0);
          local_338 = in_stack_fffffffffffffbb4;
          in_stack_fffffffffffffba8 = (Extractor *)std::max<float>(&local_2d4,&local_338);
          local_2d4 = *(float *)&in_stack_fffffffffffffba8->_vptr_Extractor;
        }
      }
      pvVar11 = std::vector<QuantBlobStat,_std::allocator<QuantBlobStat>_>::operator[]
                          ((vector<QuantBlobStat,_std::allocator<QuantBlobStat>_> *)(in_RDI + 0x140)
                           ,(long)local_284);
      in_stack_fffffffffffffba0 = (allocator_type *)std::max<float>(&pvVar11->absmax,&local_2d4);
      pvVar11->absmax = *(float *)in_stack_fffffffffffffba0;
      pvVar11->total = iVar15 * iVar2;
      ncnn::Mat::~Mat((Mat *)0x150c43);
    }
    ncnn::Extractor::~Extractor((Extractor *)in_stack_fffffffffffffb90);
  }
  for (local_344 = 0; local_344 < local_14; local_344 = local_344 + 1) {
    pvVar11 = std::vector<QuantBlobStat,_std::allocator<QuantBlobStat>_>::operator[]
                        ((vector<QuantBlobStat,_std::allocator<QuantBlobStat>_> *)(in_RDI + 0x140),
                         (long)local_344);
    fVar12 = compute_aciq_gaussian_clip
                       (in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0,
                        (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    pvVar11->threshold = fVar12;
    fVar13 = 127.0 / pvVar11->threshold;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x170),(long)local_344);
    ncnn::Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                      (int)((ulong)in_stack_fffffffffffffba8 >> 0x20),
                      (size_t)in_stack_fffffffffffffba0,
                      (Allocator *)CONCAT44(fVar12,in_stack_fffffffffffffb98));
    pvVar7 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                       ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(in_RDI + 0x170),
                        (long)local_344);
    pfVar8 = ncnn::Mat::operator[](pvVar7,0);
    *pfVar8 = fVar13;
  }
  std::vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_>::~vector
            ((vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_> *)
             in_stack_fffffffffffffba0);
  std::vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_>::~vector
            ((vector<ncnn::UnlockedPoolAllocator,_std::allocator<ncnn::UnlockedPoolAllocator>_> *)
             in_stack_fffffffffffffba0);
  return 0;
}

Assistant:

int QuantNet::quantize_ACIQ()
{
    const int input_blob_count = (int)input_blobs.size();
    const int conv_layer_count = (int)conv_layers.size();
    const int conv_bottom_blob_count = (int)conv_bottom_blobs.size();
    const int image_count = (int)listspaths[0].size();

    std::vector<ncnn::UnlockedPoolAllocator> blob_allocators(quantize_num_threads);
    std::vector<ncnn::UnlockedPoolAllocator> workspace_allocators(quantize_num_threads);

    // initialize conv weight scales
    #pragma omp parallel for num_threads(quantize_num_threads)
    for (int i = 0; i < conv_layer_count; i++)
    {
        const ncnn::Layer* layer = layers[conv_layers[i]];

        if (layer->type == "Convolution")
        {
            const ncnn::Convolution* convolution = (const ncnn::Convolution*)layer;

            const int num_output = convolution->num_output;
            const int kernel_w = convolution->kernel_w;
            const int kernel_h = convolution->kernel_h;
            const int dilation_w = convolution->dilation_w;
            const int dilation_h = convolution->dilation_h;
            const int stride_w = convolution->stride_w;
            const int stride_h = convolution->stride_h;

            const int weight_data_size_output = convolution->weight_data_size / num_output;

            // int8 winograd F43 needs weight data to use 6bit quantization
            // TODO proper condition for winograd 3x3 int8
            bool quant_6bit = false;
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
                quant_6bit = true;

            weight_scales[i].create(num_output);

            for (int n = 0; n < num_output; n++)
            {
                const ncnn::Mat weight_data_n = convolution->weight_data.range(weight_data_size_output * n, weight_data_size_output);

                float absmax = 0.f;
                for (int k = 0; k < weight_data_size_output; k++)
                {
                    absmax = std::max(absmax, (float)fabs(weight_data_n[k]));
                }

                if (quant_6bit)
                {
                    const float threshold = compute_aciq_gaussian_clip(absmax, weight_data_size_output, 6);
                    weight_scales[i][n] = 31 / threshold;
                }
                else
                {
                    const float threshold = compute_aciq_gaussian_clip(absmax, weight_data_size_output);
                    weight_scales[i][n] = 127 / threshold;
                }
            }
        }

        if (layer->type == "ConvolutionDepthWise")
        {
            const ncnn::ConvolutionDepthWise* convolutiondepthwise = (const ncnn::ConvolutionDepthWise*)layer;

            const int group = convolutiondepthwise->group;
            const int weight_data_size_output = convolutiondepthwise->weight_data_size / group;

            std::vector<float> scales;

            weight_scales[i].create(group);

            for (int n = 0; n < group; n++)
            {
                const ncnn::Mat weight_data_n = convolutiondepthwise->weight_data.range(weight_data_size_output * n, weight_data_size_output);

                float absmax = 0.f;
                for (int k = 0; k < weight_data_size_output; k++)
                {
                    absmax = std::max(absmax, (float)fabs(weight_data_n[k]));
                }

                const float threshold = compute_aciq_gaussian_clip(absmax, weight_data_size_output);
                weight_scales[i][n] = 127 / threshold;
            }
        }

        if (layer->type == "InnerProduct")
        {
            const ncnn::InnerProduct* innerproduct = (const ncnn::InnerProduct*)layer;

            const int num_output = innerproduct->num_output;
            const int weight_data_size_output = innerproduct->weight_data_size / num_output;

            weight_scales[i].create(num_output);

            for (int n = 0; n < num_output; n++)
            {
                const ncnn::Mat weight_data_n = innerproduct->weight_data.range(weight_data_size_output * n, weight_data_size_output);

                float absmax = 0.f;
                for (int k = 0; k < weight_data_size_output; k++)
                {
                    absmax = std::max(absmax, (float)fabs(weight_data_n[k]));
                }

                const float threshold = compute_aciq_gaussian_clip(absmax, weight_data_size_output);
                weight_scales[i][n] = 127 / threshold;
            }
        }
    }

    // count the absmax
    #pragma omp parallel for num_threads(quantize_num_threads) schedule(static, 1)
    for (int i = 0; i < image_count; i++)
    {
        if (i % 100 == 0)
        {
            fprintf(stderr, "count the absmax %.2f%% [ %d / %d ]\n", i * 100.f / image_count, i, image_count);
        }

        ncnn::Extractor ex = create_extractor();

        const int thread_num = ncnn::get_omp_thread_num();
        ex.set_blob_allocator(&blob_allocators[thread_num]);
        ex.set_workspace_allocator(&workspace_allocators[thread_num]);

        for (int j = 0; j < input_blob_count; j++)
        {
            const int type_to_pixel = type_to_pixels[j];
            const std::vector<float>& mean_vals = means[j];
            const std::vector<float>& norm_vals = norms[j];

            int pixel_convert_type = ncnn::Mat::PIXEL_BGR;
            if (type_to_pixel != pixel_convert_type)
            {
                pixel_convert_type = pixel_convert_type | (type_to_pixel << ncnn::Mat::PIXEL_CONVERT_SHIFT);
            }

            ncnn::Mat in = read_and_resize_image(shapes[j], listspaths[j][i], pixel_convert_type);

            in.substract_mean_normalize(mean_vals.data(), norm_vals.data());

            ex.input(input_blobs[j], in);
        }

        for (int j = 0; j < conv_bottom_blob_count; j++)
        {
            ncnn::Mat out;
            ex.extract(conv_bottom_blobs[j], out);

            // count absmax
            {
                float absmax = 0.f;

                const int outc = out.c;
                const int outsize = out.w * out.h;
                for (int p = 0; p < outc; p++)
                {
                    const float* ptr = out.channel(p);
                    for (int k = 0; k < outsize; k++)
                    {
                        absmax = std::max(absmax, (float)fabs(ptr[k]));
                    }
                }

                #pragma omp critical
                {
                    QuantBlobStat& stat = quant_blob_stats[j];
                    stat.absmax = std::max(stat.absmax, absmax);
                    stat.total = outc * outsize;
                }
            }
        }
    }

    // alpha gaussian
    #pragma omp parallel for num_threads(quantize_num_threads)
    for (int i = 0; i < conv_bottom_blob_count; i++)
    {
        QuantBlobStat& stat = quant_blob_stats[i];

        stat.threshold = compute_aciq_gaussian_clip(stat.absmax, stat.total);
        float scale = 127 / stat.threshold;

        bottom_blob_scales[i].create(1);
        bottom_blob_scales[i][0] = scale;
    }

    return 0;
}